

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O3

int make_directory(char *dir)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  char *pcVar7;
  char dir_buf [4096];
  undefined8 uStack_1040;
  char local_1038 [4104];
  
  pcVar7 = local_1038;
  local_1038[0] = '/';
  bVar3 = false;
  pcVar6 = dir;
  do {
    while( true ) {
      while( true ) {
        pcVar6 = pcVar6 + 1;
        pcVar7 = pcVar7 + 1;
        cVar2 = *pcVar6;
        if ((cVar2 == '/') || (cVar2 == '\0')) break;
        *pcVar7 = cVar2;
      }
      *pcVar7 = '\0';
      if (!bVar3) break;
      uStack_1040 = 0x119e90;
      alarm(TIMEOUT_TIME);
      uStack_1040 = 0x119e95;
      piVar5 = __errno_location();
      while( true ) {
        *piVar5 = 0;
        uStack_1040 = 0x119eac;
        iVar4 = mkdir(local_1038,0x1ff);
        if (iVar4 != -1) break;
        if (*piVar5 != 4) {
LAB_00119f53:
          uStack_1040 = 0x119f5c;
          alarm(0);
          *Lisp_errno = *piVar5;
          return 0;
        }
      }
      uStack_1040 = 0x119f0b;
      alarm(0);
      if (*pcVar6 == '\0') goto LAB_00119f7f;
LAB_00119f44:
      *pcVar7 = '/';
      bVar3 = true;
    }
    uStack_1040 = 0x119ec4;
    iVar4 = true_name(local_1038);
    if (iVar4 != -1) {
      if (iVar4 == 1) {
        return 0;
      }
      uStack_1040 = 0x119edb;
      alarm(TIMEOUT_TIME);
      uStack_1040 = 0x119ee0;
      piVar5 = __errno_location();
      while( true ) {
        *piVar5 = 0;
        uStack_1040 = 0x119ef7;
        iVar4 = mkdir(local_1038,0x1ff);
        if (iVar4 != -1) break;
        if (*piVar5 != 4) goto LAB_00119f53;
      }
      uStack_1040 = 0x119f3e;
      alarm(0);
      if (*pcVar6 == '\0') {
        return 1;
      }
      goto LAB_00119f44;
    }
    pcVar7 = (char *)((long)&uStack_1040 + 7);
    if (*pcVar6 == '\0') {
LAB_00119f7f:
      uStack_1040 = 0x119f8a;
      strcpy(dir,local_1038);
      return 1;
    }
    do {
      pcVar1 = pcVar7 + 1;
      pcVar7 = pcVar7 + 1;
    } while (*pcVar1 != '\0');
    *pcVar7 = '/';
    bVar3 = false;
  } while( true );
}

Assistant:

static int make_directory(char *dir)
{
  char *cp, *dp;
  int maked, rval;
  char dir_buf[MAXPATHLEN];

  maked = 0;

  dp = dir_buf;
  cp = dir;

#ifdef DOS
  if (DRIVESEP == *(cp + 1)) {
    *dp++ - *cp++; /* copy the drive letter and colon */
    *dp++ = *cp++;
  }
#endif /* DOS */

  *dp++ = DIRSEP; /* For a root directory. */
  cp++;           /* Skip a root directory in dir. */

  for (;;) {
    switch (*cp) {
#ifdef DOS
      case DIRSEP:
#endif
      case '/':
      case '\0':
        *dp = '\0';
        /*
         * Now, dir_buf contains the absolute path to the next
         * subdirectory or file.  If one of the parent directories
         * are created, we have to create a new subdirectory
         * anyway.  If all of the parent directories are existing
         * directories, we have to check this subdirectory is an
         * existing or not.
         */
        if (maked) {
#ifdef DOS
          TIMEOUT(rval = mkdir(dir_buf));
#else
          TIMEOUT(rval = mkdir(dir_buf, 0777));
#endif /* DOS */
          if (rval == -1) {
            *Lisp_errno = errno;
            return (0);
          }
          if (*cp == '\0') {
            strcpy(dir, dir_buf);
            return (1);
          }
          *dp++ = DIRSEP;
          cp++;
        } else {
          switch (true_name(dir_buf)) {
            case -1: /* Directory */
              if (*cp == '\0') {
                /* Every subdirectories are examined. */
                strcpy(dir, dir_buf);
                return (1);
              } else {
                dp = dir_buf;
                while (*dp) dp++;
                *dp++ = DIRSEP;
                cp++;
              }
              break;

            case 1: /* Regular File */
              /*
               * UNIX does not allow to make a directory
               * and a file in the same name on a directory.
               */
              return (0);

            default:
/*
 * Should handle other cases. (special file).
 */
#ifdef DOS
              TIMEOUT(rval = mkdir(dir_buf));
#else
              TIMEOUT(rval = mkdir(dir_buf, 0777));
#endif /* DOS */
              if (rval == -1) {
                *Lisp_errno = errno;
                return (0);
              }
              if (*cp == '\0') return (1);
              *dp++ = DIRSEP;
              cp++;
              maked = 1;
              break;
          }
        }
        break;

      default: *dp++ = *cp++; break;
    }
  }
}